

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryDirectoryHandle::TemporaryDirectoryHandle
          (TemporaryDirectoryHandle *this,DatabaseInstance *db,string *path_p,
          atomic<unsigned_long> *size_on_disk,optional_idx max_swap_space)

{
  string *args_1;
  int iVar1;
  FileSystem *pFVar2;
  pointer this_00;
  
  this->db = db;
  args_1 = &this->temp_directory;
  ::std::__cxx11::string::string((string *)args_1,(string *)path_p);
  this->created_directory = false;
  make_uniq<duckdb::TemporaryFileManager,duckdb::DatabaseInstance&,std::__cxx11::string&,std::atomic<unsigned_long>&>
            ((duckdb *)&this->temp_file,db,args_1,size_on_disk);
  pFVar2 = FileSystem::GetFileSystem(db);
  iVar1 = (*pFVar2->_vptr_FileSystem[0xd])(pFVar2,args_1,0);
  if ((char)iVar1 == '\0') {
    (*pFVar2->_vptr_FileSystem[0xe])(pFVar2,args_1,0);
    this->created_directory = true;
  }
  this_00 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
            ::operator->(&this->temp_file);
  TemporaryFileManager::SetMaxSwapSpace(this_00,max_swap_space);
  return;
}

Assistant:

TemporaryDirectoryHandle::TemporaryDirectoryHandle(DatabaseInstance &db, string path_p, atomic<idx_t> &size_on_disk,
                                                   optional_idx max_swap_space)
    : db(db), temp_directory(std::move(path_p)),
      temp_file(make_uniq<TemporaryFileManager>(db, temp_directory, size_on_disk)) {
	auto &fs = FileSystem::GetFileSystem(db);
	D_ASSERT(!temp_directory.empty());
	if (!fs.DirectoryExists(temp_directory)) {
		fs.CreateDirectory(temp_directory);
		created_directory = true;
	}
	temp_file->SetMaxSwapSpace(max_swap_space);
}